

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  _func_int *p_Var8;
  int *piVar9;
  Layer *pLVar10;
  _func_int **pp_Var11;
  void *pvVar12;
  float fVar13;
  float fVar14;
  undefined4 uVar15;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  uint _w;
  int iVar30;
  size_type sVar31;
  int iVar32;
  size_t _elemsize;
  Option *opt_00;
  long lVar33;
  uint _elempack;
  ulong uVar34;
  ulong uVar35;
  void *pvVar36;
  bool bVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  float fVar40;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar53;
  float fVar54;
  undefined1 auVar47 [16];
  float fVar55;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_258;
  ulong local_240;
  ulong local_218;
  Mat local_208;
  Mat local_1b8;
  ulong local_170;
  Mat local_168;
  int local_11c;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  int local_100;
  Allocator *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  ulong local_d8;
  _func_int ***local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  int local_b8;
  int iStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  ulong local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar17;
  undefined3 uVar19;
  undefined2 uVar21;
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) != 0)) {
    iVar24 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar24;
  }
  uVar27 = bottom_blob->c;
  uVar35 = bottom_blob->elemsize;
  iVar24 = bottom_blob->elempack;
  p_Var8 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var8);
  iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var8);
  iVar7 = *(int *)(&this->field_0xdc + (long)p_Var8);
  iVar28 = *(int *)(&this->field_0xe0 + (long)p_Var8);
  local_208.cstep = 0;
  local_208.data = (Allocator *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elempack = 0;
  local_208.elemsize._4_4_ = (int)local_208.refcount;
  local_208.allocator = (Allocator *)local_208.data;
  local_208.dims = (int)local_208.refcount;
  local_208.w = local_208.refcount._4_4_;
  local_208.h = (int)local_208.elemsize;
  local_208.d = (int)local_208.refcount;
  local_208.c = local_208.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]),bottom_blob,&local_208,opt);
  iVar23 = local_208.w;
  iVar30 = -100;
  if (((Allocator *)local_208.data == (Allocator *)0x0) ||
     ((long)local_208.c * local_208.cstep == 0)) goto LAB_004567c8;
  p_Var8 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  uVar34 = (long)(~((iVar29 + -1) * iVar7) + local_208.w) /
           (long)*(int *)(&this->field_0xe4 + (long)p_Var8);
  local_170 = uVar34 & 0xffffffff;
  _w = (int)uVar34 + 1;
  iVar29 = (~((iVar6 + -1) * iVar28) + local_208.h) / *(int *)(&this->field_0xe8 + (long)p_Var8);
  uVar34 = 1;
  if (opt->use_packing_layout == true) {
    uVar34 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var8) & 7) != 0) {
      uVar34 = (ulong)((*(uint *)(&this->field_0xd0 + (long)p_Var8) & 3) == 0) * 3 + 1;
    }
  }
  _elempack = (uint)uVar34;
  _elemsize = (uVar35 / (ulong)(long)iVar24) * uVar34;
  Mat::create(top_blob,_w,iVar29 + 1,*(int *)(&this->field_0xd0 + (long)p_Var8) / (int)_elempack,
              _elemsize,_elempack,opt->blob_allocator);
  iVar30 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_004567c8;
  p_Var8 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  uVar26 = *(uint *)(&this->field_0x108 + (long)p_Var8);
  opt_00 = (Option *)(ulong)uVar26;
  if ((iVar24 * uVar27 != uVar26) || (uVar26 != *(uint *)(&this->field_0xd0 + (long)p_Var8))) {
LAB_00455568:
    uVar25 = (int)(iVar24 * uVar27) / (int)uVar26;
    uVar26 = *(int *)(&this->field_0xd0 + (long)p_Var8) / (int)uVar26;
    local_258 = 1;
    uVar27 = 1;
    if (opt->use_packing_layout == true) {
      local_258 = (uint)((uVar25 & 3) == 0) * 3 + 1;
      if ((uVar25 & 7) == 0) {
        local_258 = 8;
      }
      uVar27 = (uint)((uVar26 & 3) == 0) * 3 + 1;
      if ((uVar26 & 7) == 0) {
        uVar27 = 8;
      }
    }
    piVar9 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
    local_168.data = local_208.data;
    local_168.refcount._0_4_ = (int)local_208.refcount;
    local_168.refcount._4_4_ = local_208.refcount._4_4_;
    local_168.elemsize._0_4_ = (int)local_208.elemsize;
    local_168.elemsize._4_4_ = local_208.elemsize._4_4_;
    local_168.elempack = local_208.elempack;
    local_168.allocator = local_208.allocator;
    local_168.w = local_208.w;
    local_168.dims = local_208.dims;
    local_168.d = local_208.d;
    local_168.h = local_208.h;
    local_168.c = local_208.c;
    local_168.cstep = local_208.cstep;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    if (local_258 < iVar24) {
      local_1b8.data = *(void **)opt;
      uVar15 = opt->openmp_blocktime;
      uVar16 = opt->use_winograd_convolution;
      uVar18 = opt->use_sgemm_convolution;
      uVar20 = opt->use_int8_inference;
      uVar22 = opt->use_vulkan_compute;
      uVar21 = CONCAT11(uVar22,uVar20);
      uVar19 = CONCAT21(uVar21,uVar18);
      uVar17 = CONCAT31(uVar19,uVar16);
      local_1b8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1b8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      local_1b8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1b8.c._0_1_ = opt->use_winograd43_convolution;
      local_1b8.c._1_1_ = opt->use_winograd63_convolution;
      local_1b8.c._2_1_ = opt->use_reserved_6;
      local_1b8.c._3_1_ = opt->use_reserved_7;
      local_1b8._60_1_ = opt->use_reserved_8;
      local_1b8._61_1_ = opt->use_reserved_9;
      local_1b8._62_1_ = opt->use_reserved_10;
      local_1b8._63_1_ = opt->use_reserved_11;
      local_1b8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      local_1b8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_1b8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      local_1b8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_1b8.elempack = uVar15;
      local_1b8._28_4_ = uVar17;
      convert_packing(&local_208,&local_168,local_258,(Option *)&local_1b8);
    }
    piVar9 = top_blob->refcount;
    local_1b8.data = top_blob->data;
    local_1b8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1b8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_1b8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_1b8.elempack = top_blob->elempack;
    local_1b8.allocator = top_blob->allocator;
    local_1b8.dims = top_blob->dims;
    local_1b8.w = top_blob->w;
    local_1b8.h = top_blob->h;
    local_1b8.d = top_blob->d;
    local_1b8.c = top_blob->c;
    local_1b8.cstep = top_blob->cstep;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    if (uVar27 < _elempack) {
      Mat::create(&local_1b8,_w,iVar29 + 1,
                  *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
                  (int)uVar27,(ulong)uVar27 * (_elemsize / uVar34),uVar27,opt->workspace_allocator);
      iVar30 = -100;
      if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0))
      goto LAB_00455785;
    }
    else {
LAB_00455785:
      if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3])) {
        local_170 = CONCAT44(local_170._4_4_,(int)uVar25 / local_258);
        iVar29 = 0;
        iVar24 = 0;
        lVar33 = 0;
        do {
          local_88 = CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize);
          local_c8 = (_func_int ***)
                     ((long)(_func_int ***)local_168.data +
                     (long)(iVar29 / local_258) * local_168.cstep * local_88);
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = (int)local_168.elemsize;
          iStack_b4 = local_168.elemsize._4_4_;
          local_b0 = local_168.elempack;
          local_a8 = local_168.allocator;
          local_90 = (int)local_170;
          local_88 = ((long)local_168.d * local_88 * (long)local_168.h * (long)local_168.w + 0xf &
                     0xfffffffffffffff0) / local_88;
          local_a0._0_4_ = local_168.dims;
          local_a0._4_4_ = local_168.w;
          uStack_98._0_4_ = local_168.h;
          uStack_98._4_4_ = local_168.d;
          local_d8 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          local_118 = (void *)((long)(iVar24 / (int)uVar27) * local_1b8.cstep * local_d8 +
                              (long)local_1b8.data);
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = (undefined4)local_1b8.elemsize;
          uStack_104 = local_1b8.elemsize._4_4_;
          local_100 = local_1b8.elempack;
          local_f8 = local_1b8.allocator;
          local_d8 = ((long)local_1b8.d * local_d8 * (long)local_1b8.h * (long)local_1b8.w + 0xf &
                     0xfffffffffffffff0) / local_d8;
          local_f0._0_4_ = local_1b8.dims;
          local_f0._4_4_ = local_1b8.w;
          uStack_e8._0_4_ = local_1b8.h;
          uStack_e8._4_4_ = local_1b8.d;
          pLVar10 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar33];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          pAStack_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_reserved_6;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          pAStack_70 = local_1b8.allocator;
          local_e0 = (int)uVar26 / (int)uVar27;
          (*pLVar10->_vptr_Layer[7])(pLVar10,&local_c8,&local_118);
          piVar9 = (int *)CONCAT44(uStack_10c,uStack_110);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (local_f8 == (Allocator *)0x0) {
                if (local_118 != (void *)0x0) {
                  free(local_118);
                }
              }
              else {
                (*local_f8->_vptr_Allocator[3])();
              }
            }
          }
          local_d8 = 0;
          local_118 = (void *)0x0;
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = 0;
          uStack_104 = 0;
          local_100 = 0;
          local_f0 = 0;
          uStack_e8 = 0;
          local_e0 = 0;
          piVar9 = (int *)CONCAT44(uStack_bc,uStack_c0);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (local_a8 == (Allocator *)0x0) {
                if (local_c8 != (_func_int ***)0x0) {
                  free(local_c8);
                }
              }
              else {
                (*local_a8->_vptr_Allocator[3])();
              }
            }
          }
          local_88 = 0;
          local_c8 = (_func_int ***)0x0;
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = 0;
          iStack_b4 = 0;
          local_b0 = 0;
          local_a0 = 0;
          uStack_98 = 0;
          local_90 = 0;
          lVar33 = lVar33 + 1;
          iVar24 = iVar24 + uVar26;
          iVar29 = iVar29 + uVar25;
        } while (lVar33 < *(int *)(&this->field_0x108 +
                                  (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      }
      if (uVar27 < _elempack) {
        convert_packing(&local_1b8,top_blob,_elempack,opt);
        iVar30 = 0;
      }
      else {
        iVar30 = 0;
        if (&local_1b8 != top_blob) {
          piVar9 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + 1;
            UNLOCK();
          }
          piVar9 = top_blob->refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar30 = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_1b8.data;
          top_blob->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          top_blob->elempack = local_1b8.elempack;
          top_blob->allocator = local_1b8.allocator;
          top_blob->dims = local_1b8.dims;
          top_blob->w = local_1b8.w;
          top_blob->h = local_1b8.h;
          top_blob->d = local_1b8.d;
          top_blob->c = local_1b8.c;
          top_blob->cstep = local_1b8.cstep;
        }
      }
    }
    piVar9 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8._56_8_ = local_1b8._56_8_ & 0xffffffff00000000;
    piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_168.data != (Allocator *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    goto LAB_004567c8;
  }
  if (iVar24 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var8) != 3) goto LAB_00455568;
    if ((((*(int *)(&this->field_0xd8 + (long)p_Var8) == 3) &&
         (*(int *)(&this->field_0xdc + (long)p_Var8) == 1)) &&
        (*(int *)(&this->field_0xe0 + (long)p_Var8) == 1)) &&
       ((*(int *)(&this->field_0xe4 + (long)p_Var8) == 1 &&
        (*(int *)(&this->field_0xe8 + (long)p_Var8) == 1)))) {
      convdw3x3s1_sse(&local_208,top_blob,&this->weight_data_tm,
                      (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
    }
    else {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var8) != 3) ||
           ((*(int *)(&this->field_0xdc + (long)p_Var8) != 1 ||
            (*(int *)(&this->field_0xe0 + (long)p_Var8) != 1)))) ||
          (*(int *)(&this->field_0xe4 + (long)p_Var8) != 2)) ||
         (*(int *)(&this->field_0xe8 + (long)p_Var8) != 2)) goto LAB_00455568;
      convdw3x3s2_sse(&local_208,top_blob,&this->weight_data_tm,
                      (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
    }
LAB_004563a0:
    pLVar10 = this->activation;
    if (pLVar10 != (Layer *)0x0) {
      (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
    }
  }
  else {
    if (iVar24 == 4) {
      iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var8);
      if ((long)iVar24 == 3) {
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var8) == 3) &&
             (*(int *)(&this->field_0xdc + (long)p_Var8) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var8) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var8) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var8) == 1)))) {
          convdw3x3s1_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
        }
        else {
          if (((iVar24 != 3) ||
              ((*(int *)(&this->field_0xd8 + (long)p_Var8) != 3 ||
               (*(int *)(&this->field_0xdc + (long)p_Var8) != 1)))) ||
             ((*(int *)(&this->field_0xe0 + (long)p_Var8) != 1 ||
              ((*(int *)(&this->field_0xe4 + (long)p_Var8) != 2 ||
               (*(int *)(&this->field_0xe8 + (long)p_Var8) != 2)))))) goto LAB_004554b2;
          convdw3x3s2_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
        }
      }
      else {
LAB_004554b2:
        if (iVar24 != 5) {
LAB_00455c44:
          sVar31 = (long)*(int *)(&this->field_0xd8 + (long)p_Var8) * (long)iVar24;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_168,sVar31,
                     (allocator_type *)&local_1b8);
          pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
          p_Var8 = pp_Var11[-3];
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var8)) {
            iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var8);
            iVar6 = *(int *)(&this->field_0xdc + (long)p_Var8);
            iVar7 = *(int *)(&this->field_0xd4 + (long)p_Var8);
            iVar28 = 0;
            iVar30 = 0;
            iVar32 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3])) {
                lVar33 = 0;
                do {
                  *(int *)((long)local_168.data + (iVar32 + lVar33) * 4) = iVar30;
                  iVar30 = iVar30 + *(int *)(&this->field_0xdc + (long)pp_Var11[-3]);
                  lVar33 = lVar33 + 1;
                } while ((int)lVar33 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]));
                iVar32 = iVar32 + (int)lVar33;
              }
              iVar30 = iVar30 + (iVar23 * iVar24 - iVar6 * iVar7);
              iVar28 = iVar28 + 1;
            } while (iVar28 < *(int *)(&this->field_0xd8 + (long)pp_Var11[-3]));
          }
          if (0 < (int)uVar27) {
            local_11c = (int)sVar31 * 4;
            iVar24 = 0;
            auVar39 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
            auVar66._8_4_ = 0x3f800000;
            auVar66._0_8_ = 0x3f8000003f800000;
            auVar66._12_4_ = 0x3f800000;
            local_218 = 0;
            do {
              if (-1 < iVar29) {
                pvVar36 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize +
                                  (long)top_blob->data);
                pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
                pvVar12 = (this->weight_data_tm).data;
                iVar6 = 0;
                do {
                  if (-1 < (int)local_170) {
                    uVar35 = 0;
                    do {
                      p_Var8 = pp_Var11[-3];
                      if (*(int *)(&this->field_0x100 + (long)p_Var8) == 0) {
                        auVar75 = ZEXT816(0) << 0x40;
                      }
                      else {
                        auVar75 = *(undefined1 (*) [16])
                                   (*(long *)(&this->field_0x1b0 + (long)p_Var8) + local_218 * 0x10)
                        ;
                      }
                      if (0 < (int)sVar31) {
                        lVar33 = 0;
                        auVar68 = auVar75;
                        do {
                          pfVar2 = (float *)((long)pvVar12 + lVar33 * 4 + (long)iVar24 * 4);
                          pfVar1 = (float *)((long)&((Allocator *)
                                                    ((long)local_208.data +
                                                    (long)*(int *)((long)local_168.data + lVar33) *
                                                    2 * 8))->_vptr_Allocator +
                                            (long)(*(int *)(&this->field_0xe4 + (long)p_Var8) *
                                                   (int)uVar35 * 4) * 4 +
                                            (long)*(int *)(&this->field_0xe8 + (long)p_Var8) *
                                            (long)iVar6 *
                                            (long)local_208.w *
                                            CONCAT44(local_208.elemsize._4_4_,
                                                     (int)local_208.elemsize) +
                                            local_208.cstep * local_218 *
                                            CONCAT44(local_208.elemsize._4_4_,
                                                     (int)local_208.elemsize));
                          auVar75._0_4_ = *pfVar2 * *pfVar1 + auVar68._0_4_;
                          auVar75._4_4_ = pfVar2[1] * pfVar1[1] + auVar68._4_4_;
                          auVar75._8_4_ = pfVar2[2] * pfVar1[2] + auVar68._8_4_;
                          auVar75._12_4_ = pfVar2[3] * pfVar1[3] + auVar68._12_4_;
                          lVar33 = lVar33 + 4;
                          auVar68 = auVar75;
                        } while ((sVar31 & 0xffffffff) << 2 != lVar33);
                      }
                      fVar4 = auVar39._0_4_;
                      fVar5 = auVar39._4_4_;
                      fVar13 = auVar39._8_4_;
                      fVar14 = auVar39._12_4_;
                      fVar40 = auVar75._4_4_;
                      fVar44 = auVar75._8_4_;
                      fVar45 = auVar75._12_4_;
                      switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var8)) {
                      case 1:
                        auVar75 = vmaxps_avx(auVar75,_DAT_0054b030);
                        break;
                      case 2:
                        auVar68 = vmaxps_avx(auVar75,ZEXT816(0) << 0x40);
                        auVar78 = vminps_avx(auVar75,ZEXT816(0) << 0x40);
                        fVar4 = **(float **)(&this->field_0x118 + (long)p_Var8);
                        auVar75._0_4_ = fVar4 * auVar78._0_4_ + auVar68._0_4_;
                        auVar75._4_4_ = fVar4 * auVar78._4_4_ + auVar68._4_4_;
                        auVar75._8_4_ = fVar4 * auVar78._8_4_ + auVar68._8_4_;
                        auVar75._12_4_ = fVar4 * auVar78._12_4_ + auVar68._12_4_;
                        break;
                      case 3:
                        uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var8);
                        auVar72._4_4_ = uVar3;
                        auVar72._0_4_ = uVar3;
                        auVar72._8_4_ = uVar3;
                        auVar72._12_4_ = uVar3;
                        uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var8))[1];
                        auVar81._4_4_ = uVar3;
                        auVar81._0_4_ = uVar3;
                        auVar81._8_4_ = uVar3;
                        auVar81._12_4_ = uVar3;
                        auVar75 = vmaxps_avx(auVar75,auVar72);
                        auVar75 = vminps_avx(auVar81,auVar75);
                        break;
                      case 4:
                        auVar41._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                        auVar41._8_4_ = -fVar44;
                        auVar41._12_4_ = -fVar45;
                        auVar51._8_4_ = 0x42b0c0a5;
                        auVar51._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar51._12_4_ = 0x42b0c0a5;
                        auVar75 = vminps_avx(auVar41,auVar51);
                        auVar52._8_4_ = 0xc2b0c0a5;
                        auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar52._12_4_ = 0xc2b0c0a5;
                        auVar78 = vmaxps_avx(auVar75,auVar52);
                        auVar73._0_4_ = fVar4 + auVar78._0_4_ * 1.442695;
                        auVar73._4_4_ = fVar5 + auVar78._4_4_ * 1.442695;
                        auVar73._8_4_ = fVar13 + auVar78._8_4_ * 1.442695;
                        auVar73._12_4_ = fVar14 + auVar78._12_4_ * 1.442695;
                        auVar82._0_4_ = (int)auVar73._0_4_;
                        auVar82._4_4_ = (int)auVar73._4_4_;
                        auVar82._8_4_ = (int)auVar73._8_4_;
                        auVar82._12_4_ = (int)auVar73._12_4_;
                        auVar68 = vcvtdq2ps_avx(auVar82);
                        auVar75 = vcmpps_avx(auVar73,auVar68,1);
                        auVar75 = vandps_avx(auVar75,auVar66);
                        auVar75 = vsubps_avx(auVar68,auVar75);
                        fVar40 = auVar75._0_4_ * -0.6931472 + auVar78._0_4_;
                        fVar44 = auVar75._4_4_ * -0.6931472 + auVar78._4_4_;
                        fVar45 = auVar75._8_4_ * -0.6931472 + auVar78._8_4_;
                        fVar46 = auVar75._12_4_ * -0.6931472 + auVar78._12_4_;
                        auVar74._0_4_ = (int)auVar75._0_4_;
                        auVar74._4_4_ = (int)auVar75._4_4_;
                        auVar74._8_4_ = (int)auVar75._8_4_;
                        auVar74._12_4_ = (int)auVar75._12_4_;
                        auVar75 = vpslld_avx(auVar74,0x17);
                        auVar75 = vpaddd_avx(auVar75,auVar66);
                        auVar42._0_4_ =
                             (fVar40 * fVar40 *
                              (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) *
                                 fVar40 + 0.041665796) * fVar40 + 0.16666666) * fVar40 + fVar4) +
                             fVar40 + 1.0) * auVar75._0_4_ + 1.0;
                        auVar42._4_4_ =
                             (fVar44 * fVar44 *
                              (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) *
                                 fVar44 + 0.041665796) * fVar44 + 0.16666666) * fVar44 + fVar5) +
                             fVar44 + 1.0) * auVar75._4_4_ + 1.0;
                        auVar42._8_4_ =
                             (fVar45 * fVar45 *
                              (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) *
                                 fVar45 + 0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar13) +
                             fVar45 + 1.0) * auVar75._8_4_ + 1.0;
                        auVar42._12_4_ =
                             (fVar46 * fVar46 *
                              (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) *
                                 fVar46 + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar14) +
                             fVar46 + 1.0) * auVar75._12_4_ + 1.0;
                        auVar75 = vrcpps_avx(auVar42);
                        fVar4 = auVar75._0_4_;
                        auVar43._0_4_ = auVar42._0_4_ * fVar4;
                        fVar5 = auVar75._4_4_;
                        auVar43._4_4_ = auVar42._4_4_ * fVar5;
                        fVar13 = auVar75._8_4_;
                        auVar43._8_4_ = auVar42._8_4_ * fVar13;
                        fVar14 = auVar75._12_4_;
                        auVar43._12_4_ = auVar42._12_4_ * fVar14;
                        auVar68 = vsubps_avx(auVar66,auVar43);
                        auVar75._0_4_ = fVar4 + fVar4 * auVar68._0_4_;
                        auVar75._4_4_ = fVar5 + fVar5 * auVar68._4_4_;
                        auVar75._8_4_ = fVar13 + fVar13 * auVar68._8_4_;
                        auVar75._12_4_ = fVar14 + fVar14 * auVar68._12_4_;
                        break;
                      case 5:
                        auVar64._8_4_ = 0x42b0c0a5;
                        auVar64._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar64._12_4_ = 0x42b0c0a5;
                        auVar68 = vminps_avx(auVar75,auVar64);
                        auVar76._8_4_ = 0xc2b0c0a5;
                        auVar76._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar76._12_4_ = 0xc2b0c0a5;
                        auVar47 = vmaxps_avx(auVar76,auVar68);
                        auVar77._0_4_ = auVar47._0_4_ * 1.442695 + fVar4;
                        auVar77._4_4_ = auVar47._4_4_ * 1.442695 + fVar5;
                        auVar77._8_4_ = auVar47._8_4_ * 1.442695 + fVar13;
                        auVar77._12_4_ = auVar47._12_4_ * 1.442695 + fVar14;
                        auVar79._0_4_ = (int)auVar77._0_4_;
                        auVar79._4_4_ = (int)auVar77._4_4_;
                        auVar79._8_4_ = (int)auVar77._8_4_;
                        auVar79._12_4_ = (int)auVar77._12_4_;
                        auVar78 = vcvtdq2ps_avx(auVar79);
                        auVar68 = vcmpps_avx(auVar77,auVar78,1);
                        auVar68 = vandps_avx(auVar68,auVar66);
                        auVar68 = vsubps_avx(auVar78,auVar68);
                        auVar80._0_4_ = auVar68._0_4_ * 0.6931472;
                        auVar80._4_4_ = auVar68._4_4_ * 0.6931472;
                        auVar80._8_4_ = auVar68._8_4_ * 0.6931472;
                        auVar80._12_4_ = auVar68._12_4_ * 0.6931472;
                        auVar78 = vsubps_avx(auVar47,auVar80);
                        fVar46 = auVar78._0_4_;
                        fVar53 = auVar78._4_4_;
                        fVar54 = auVar78._8_4_;
                        fVar55 = auVar78._12_4_;
                        auVar67._0_4_ = (int)auVar68._0_4_;
                        auVar67._4_4_ = (int)auVar68._4_4_;
                        auVar67._8_4_ = (int)auVar68._8_4_;
                        auVar67._12_4_ = (int)auVar68._12_4_;
                        auVar68 = vpslld_avx(auVar67,0x17);
                        auVar68 = vpaddd_avx(auVar68,auVar66);
                        auVar69._0_4_ =
                             (fVar46 + 1.0 +
                             fVar46 * fVar46 *
                             (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) *
                                fVar46 + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar4)) *
                             auVar68._0_4_ + 1.0;
                        auVar69._4_4_ =
                             (fVar53 + 1.0 +
                             fVar53 * fVar53 *
                             (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) *
                                fVar53 + 0.041665796) * fVar53 + 0.16666666) * fVar53 + fVar5)) *
                             auVar68._4_4_ + 1.0;
                        auVar69._8_4_ =
                             (fVar54 + 1.0 +
                             fVar54 * fVar54 *
                             (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) *
                                fVar54 + 0.041665796) * fVar54 + 0.16666666) * fVar54 + fVar13)) *
                             auVar68._8_4_ + 1.0;
                        auVar69._12_4_ =
                             (fVar55 + 1.0 +
                             fVar55 * fVar55 *
                             (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) *
                                fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + fVar14)) *
                             auVar68._12_4_ + 1.0;
                        auVar47._8_4_ = 0x800000;
                        auVar47._0_8_ = 0x80000000800000;
                        auVar47._12_4_ = 0x800000;
                        auVar68 = vmaxps_avx(auVar69,auVar47);
                        auVar78 = vpsrld_avx(auVar68,0x17);
                        auVar56._8_4_ = 0xffffff82;
                        auVar56._0_8_ = 0xffffff82ffffff82;
                        auVar56._12_4_ = 0xffffff82;
                        auVar78 = vpaddd_avx(auVar78,auVar56);
                        auVar57._8_4_ = 0x807fffff;
                        auVar57._0_8_ = 0x807fffff807fffff;
                        auVar57._12_4_ = 0x807fffff;
                        auVar68 = vandps_avx(auVar68,auVar57);
                        auVar48 = vorps_avx(auVar68,auVar39._0_16_);
                        auVar47 = vcvtdq2ps_avx(auVar78);
                        auVar58._8_4_ = 0x3f3504f3;
                        auVar58._0_8_ = 0x3f3504f33f3504f3;
                        auVar58._12_4_ = 0x3f3504f3;
                        auVar78 = vcmpps_avx(auVar48,auVar58,1);
                        auVar68 = vandps_avx(auVar78,auVar48);
                        fVar46 = auVar48._0_4_ + -1.0 + auVar68._0_4_;
                        fVar53 = auVar48._4_4_ + -1.0 + auVar68._4_4_;
                        fVar54 = auVar48._8_4_ + -1.0 + auVar68._8_4_;
                        fVar55 = auVar48._12_4_ + -1.0 + auVar68._12_4_;
                        auVar68 = vandps_avx(auVar78,auVar66);
                        auVar78 = vsubps_avx(auVar47,auVar68);
                        auVar68 = vcmpps_avx(auVar69,_DAT_0054b030,2);
                        auVar48._0_4_ =
                             (fVar46 * fVar46 *
                              (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) *
                                     fVar46 + -0.12420141) * fVar46 + 0.14249323) * fVar46 +
                                  -0.16668057) * fVar46 + 0.20000714) * fVar46 + -0.24999994) *
                                fVar46 + 0.3333333) * fVar46 + -0.5) +
                             auVar78._0_4_ * 0.6931472 + fVar46) * -2.0;
                        auVar48._4_4_ =
                             (fVar53 * fVar53 *
                              (((((((((fVar53 * 0.070376836 + -0.1151461) * fVar53 + 0.116769984) *
                                     fVar53 + -0.12420141) * fVar53 + 0.14249323) * fVar53 +
                                  -0.16668057) * fVar53 + 0.20000714) * fVar53 + -0.24999994) *
                                fVar53 + 0.3333333) * fVar53 + -0.5) +
                             auVar78._4_4_ * 0.6931472 + fVar53) * -2.0;
                        auVar48._8_4_ =
                             (fVar54 * fVar54 *
                              (((((((((fVar54 * 0.070376836 + -0.1151461) * fVar54 + 0.116769984) *
                                     fVar54 + -0.12420141) * fVar54 + 0.14249323) * fVar54 +
                                  -0.16668057) * fVar54 + 0.20000714) * fVar54 + -0.24999994) *
                                fVar54 + 0.3333333) * fVar54 + -0.5) +
                             auVar78._8_4_ * 0.6931472 + fVar54) * -2.0;
                        auVar48._12_4_ =
                             (fVar55 * fVar55 *
                              (((((((((fVar55 * 0.070376836 + -0.1151461) * fVar55 + 0.116769984) *
                                     fVar55 + -0.12420141) * fVar55 + 0.14249323) * fVar55 +
                                  -0.16668057) * fVar55 + 0.20000714) * fVar55 + -0.24999994) *
                                fVar55 + 0.3333333) * fVar55 + -0.5) +
                             auVar78._12_4_ * 0.6931472 + fVar55) * -2.0;
                        auVar59._8_4_ = 0x7fffffff;
                        auVar59._0_8_ = 0x7fffffff7fffffff;
                        auVar59._12_4_ = 0x7fffffff;
                        auVar68 = vblendvps_avx(auVar48,auVar59,auVar68);
                        auVar60._8_4_ = 0x42b0c0a5;
                        auVar60._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar60._12_4_ = 0x42b0c0a5;
                        auVar68 = vminps_avx(auVar68,auVar60);
                        auVar61._8_4_ = 0xc2b0c0a5;
                        auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar61._12_4_ = 0xc2b0c0a5;
                        auVar47 = vmaxps_avx(auVar68,auVar61);
                        auVar62._0_4_ = auVar47._0_4_ * 1.442695 + fVar4;
                        auVar62._4_4_ = auVar47._4_4_ * 1.442695 + fVar5;
                        auVar62._8_4_ = auVar47._8_4_ * 1.442695 + fVar13;
                        auVar62._12_4_ = auVar47._12_4_ * 1.442695 + fVar14;
                        auVar70._0_4_ = (int)auVar62._0_4_;
                        auVar70._4_4_ = (int)auVar62._4_4_;
                        auVar70._8_4_ = (int)auVar62._8_4_;
                        auVar70._12_4_ = (int)auVar62._12_4_;
                        auVar78 = vcvtdq2ps_avx(auVar70);
                        auVar68 = vcmpps_avx(auVar62,auVar78,1);
                        auVar68 = vandps_avx(auVar68,auVar66);
                        auVar68 = vsubps_avx(auVar78,auVar68);
                        auVar71._0_4_ = auVar68._0_4_ * 0.6931472;
                        auVar71._4_4_ = auVar68._4_4_ * 0.6931472;
                        auVar71._8_4_ = auVar68._8_4_ * 0.6931472;
                        auVar71._12_4_ = auVar68._12_4_ * 0.6931472;
                        auVar78 = vsubps_avx(auVar47,auVar71);
                        fVar46 = auVar78._0_4_;
                        fVar53 = auVar78._4_4_;
                        fVar54 = auVar78._8_4_;
                        fVar55 = auVar78._12_4_;
                        auVar39 = ZEXT1664(auVar39._0_16_);
                        auVar63._0_4_ = (int)auVar68._0_4_;
                        auVar63._4_4_ = (int)auVar68._4_4_;
                        auVar63._8_4_ = (int)auVar68._8_4_;
                        auVar63._12_4_ = (int)auVar68._12_4_;
                        auVar68 = vpslld_avx(auVar63,0x17);
                        auVar68 = vpaddd_avx(auVar68,auVar66);
                        auVar49._0_4_ =
                             (fVar46 + 1.0 +
                             (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) *
                                fVar46 + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar4) *
                             fVar46 * fVar46) * auVar68._0_4_ + 1.0;
                        auVar49._4_4_ =
                             (fVar53 + 1.0 +
                             (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) *
                                fVar53 + 0.041665796) * fVar53 + 0.16666666) * fVar53 + fVar5) *
                             fVar53 * fVar53) * auVar68._4_4_ + 1.0;
                        auVar49._8_4_ =
                             (fVar54 + 1.0 +
                             (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) *
                                fVar54 + 0.041665796) * fVar54 + 0.16666666) * fVar54 + fVar13) *
                             fVar54 * fVar54) * auVar68._8_4_ + 1.0;
                        auVar49._12_4_ =
                             (fVar55 + 1.0 +
                             (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) *
                                fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + fVar14) *
                             fVar55 * fVar55) * auVar68._12_4_ + 1.0;
                        auVar68 = vrcpps_avx(auVar49);
                        fVar4 = auVar68._0_4_;
                        fVar5 = auVar68._4_4_;
                        fVar13 = auVar68._8_4_;
                        fVar14 = auVar68._12_4_;
                        auVar50._0_4_ = auVar49._0_4_ * (fVar4 + fVar4);
                        auVar50._4_4_ = auVar49._4_4_ * (fVar5 + fVar5);
                        auVar50._8_4_ = auVar49._8_4_ * (fVar13 + fVar13);
                        auVar50._12_4_ = auVar49._12_4_ * (fVar14 + fVar14);
                        auVar65._8_4_ = 0x40000000;
                        auVar65._0_8_ = 0x4000000040000000;
                        auVar65._12_4_ = 0x40000000;
                        auVar78 = vsubps_avx(auVar65,auVar50);
                        auVar68._0_4_ = fVar4 + fVar4 + -1.0 + fVar4 * auVar78._0_4_;
                        auVar68._4_4_ = fVar5 + fVar5 + -1.0 + fVar5 * auVar78._4_4_;
                        auVar68._8_4_ = fVar13 + fVar13 + -1.0 + fVar13 * auVar78._8_4_;
                        auVar68._12_4_ = fVar14 + fVar14 + -1.0 + fVar14 * auVar78._12_4_;
                        goto LAB_004562c3;
                      case 6:
                        fVar4 = **(float **)(&this->field_0x118 + (long)p_Var8);
                        fVar5 = (*(float **)(&this->field_0x118 + (long)p_Var8))[1];
                        auVar78._0_4_ = fVar4 * auVar75._0_4_ + fVar5;
                        auVar78._4_4_ = fVar4 * fVar40 + fVar5;
                        auVar78._8_4_ = fVar4 * fVar44 + fVar5;
                        auVar78._12_4_ = fVar4 * fVar45 + fVar5;
                        auVar68 = vmaxps_avx(auVar78,_DAT_0054b030);
                        auVar68 = vminps_avx(auVar68,auVar66);
LAB_004562c3:
                        auVar75._0_4_ = auVar68._0_4_ * auVar75._0_4_;
                        auVar75._4_4_ = auVar68._4_4_ * fVar40;
                        auVar75._8_4_ = auVar68._8_4_ * fVar44;
                        auVar75._12_4_ = auVar68._12_4_ * fVar45;
                      }
                      *(undefined1 (*) [16])((long)pvVar36 + uVar35 * 0x10) = auVar75;
                      uVar35 = uVar35 + 1;
                    } while (uVar35 != _w);
                  }
                  pvVar36 = (void *)((long)pvVar36 + (long)(int)(_w * 4) * 4);
                  bVar37 = iVar6 != iVar29;
                  iVar6 = iVar6 + 1;
                } while (bVar37);
              }
              local_218 = local_218 + 1;
              iVar24 = iVar24 + local_11c;
            } while (local_218 != uVar27);
          }
          if (local_168.data != (void *)0x0) {
            operator_delete(local_168.data,
                            CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize) -
                            (long)local_168.data);
          }
          iVar30 = 0;
          goto LAB_004567c8;
        }
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var8) == 5) &&
             (*(int *)(&this->field_0xdc + (long)p_Var8) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var8) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var8) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var8) == 1)))) {
          convdw5x5s1_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
        }
        else {
          if (((*(int *)(&this->field_0xd8 + (long)p_Var8) != 5) ||
              ((*(int *)(&this->field_0xdc + (long)p_Var8) != 1 ||
               (*(int *)(&this->field_0xe0 + (long)p_Var8) != 1)))) ||
             ((*(int *)(&this->field_0xe4 + (long)p_Var8) != 2 ||
              (*(int *)(&this->field_0xe8 + (long)p_Var8) != 2)))) goto LAB_00455c44;
          convdw5x5s2_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
        }
      }
      goto LAB_004563a0;
    }
    if (iVar24 != 8) goto LAB_00455568;
    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var8);
    if ((long)iVar24 == 3) {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var8) == 3) &&
           (*(int *)(&this->field_0xdc + (long)p_Var8) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var8) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var8) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var8) == 1)))) {
        convdw3x3s1_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
      }
      else {
        if ((((iVar24 != 3) ||
             ((*(int *)(&this->field_0xd8 + (long)p_Var8) != 3 ||
              (*(int *)(&this->field_0xdc + (long)p_Var8) != 1)))) ||
            (*(int *)(&this->field_0xe0 + (long)p_Var8) != 1)) ||
           ((*(int *)(&this->field_0xe4 + (long)p_Var8) != 2 ||
            (*(int *)(&this->field_0xe8 + (long)p_Var8) != 2)))) goto LAB_00455b8e;
        convdw3x3s2_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
      }
      goto LAB_004563a0;
    }
LAB_00455b8e:
    if (iVar24 == 5) {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var8) == 5) &&
           (*(int *)(&this->field_0xdc + (long)p_Var8) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var8) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var8) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var8) == 1)))) {
        convdw5x5s1_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
      }
      else {
        if (((*(int *)(&this->field_0xd8 + (long)p_Var8) != 5) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var8) != 1 ||
             (*(int *)(&this->field_0xe0 + (long)p_Var8) != 1)))) ||
           ((*(int *)(&this->field_0xe4 + (long)p_Var8) != 2 ||
            (*(int *)(&this->field_0xe8 + (long)p_Var8) != 2)))) goto LAB_004563c0;
        convdw5x5s2_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var8),opt_00);
      }
      goto LAB_004563a0;
    }
LAB_004563c0:
    sVar31 = (long)*(int *)(&this->field_0xd8 + (long)p_Var8) * (long)iVar24;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_168,sVar31,(allocator_type *)&local_1b8);
    pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
    p_Var8 = pp_Var11[-3];
    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var8)) {
      iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var8);
      iVar6 = *(int *)(&this->field_0xdc + (long)p_Var8);
      iVar7 = *(int *)(&this->field_0xd4 + (long)p_Var8);
      iVar28 = 0;
      iVar30 = 0;
      iVar32 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3])) {
          lVar33 = 0;
          do {
            *(int *)((long)local_168.data + (iVar28 + lVar33) * 4) = iVar30;
            iVar30 = iVar30 + *(int *)(&this->field_0xdc + (long)pp_Var11[-3]);
            lVar33 = lVar33 + 1;
          } while ((int)lVar33 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]));
          iVar28 = iVar28 + (int)lVar33;
        }
        iVar30 = iVar30 + (iVar23 * iVar24 - iVar6 * iVar7);
        iVar32 = iVar32 + 1;
      } while (iVar32 < *(int *)(&this->field_0xd8 + (long)pp_Var11[-3]));
    }
    if (0 < (int)uVar27) {
      iVar24 = 0;
      local_240 = 0;
      do {
        if (-1 < iVar29) {
          pvVar36 = (void *)(top_blob->cstep * local_240 * top_blob->elemsize + (long)top_blob->data
                            );
          pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
          pvVar12 = (this->weight_data_tm).data;
          iVar6 = 0;
          do {
            if (-1 < (int)local_170) {
              uVar35 = 0;
              do {
                p_Var8 = pp_Var11[-3];
                if (*(int *)(&this->field_0x100 + (long)p_Var8) == 0) {
                  auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar39 = ZEXT3264(*(undefined1 (*) [32])
                                      (*(long *)(&this->field_0x1b0 + (long)p_Var8) +
                                      local_240 * 0x20));
                }
                auVar38 = auVar39._0_32_;
                if (0 < (int)sVar31) {
                  lVar33 = 0;
                  do {
                    pfVar2 = (float *)((long)pvVar12 + lVar33 * 8 + (long)iVar24 * 4);
                    pfVar1 = (float *)((long)&((Allocator *)
                                              ((long)local_208.data +
                                              (long)*(int *)((long)local_168.data + lVar33) * 4 * 8)
                                              )->_vptr_Allocator +
                                      (long)(*(int *)(&this->field_0xe4 + (long)p_Var8) *
                                             (int)uVar35 * 8) * 4 +
                                      (long)*(int *)(&this->field_0xe8 + (long)p_Var8) * (long)iVar6
                                      * (long)local_208.w *
                                        CONCAT44(local_208.elemsize._4_4_,(int)local_208.elemsize) +
                                      local_208.cstep * local_240 *
                                      CONCAT44(local_208.elemsize._4_4_,(int)local_208.elemsize));
                    auVar38._0_4_ = *pfVar2 * *pfVar1 + auVar39._0_4_;
                    auVar38._4_4_ = pfVar2[1] * pfVar1[1] + auVar39._4_4_;
                    auVar38._8_4_ = pfVar2[2] * pfVar1[2] + auVar39._8_4_;
                    auVar38._12_4_ = pfVar2[3] * pfVar1[3] + auVar39._12_4_;
                    auVar38._16_4_ = pfVar2[4] * pfVar1[4] + auVar39._16_4_;
                    auVar38._20_4_ = pfVar2[5] * pfVar1[5] + auVar39._20_4_;
                    auVar38._24_4_ = pfVar2[6] * pfVar1[6] + auVar39._24_4_;
                    auVar38._28_4_ = pfVar2[7] + auVar39._28_4_;
                    auVar39 = ZEXT3264(auVar38);
                    lVar33 = lVar33 + 4;
                  } while ((sVar31 & 0xffffffff) << 2 != lVar33);
                }
                *(undefined1 (*) [32])((long)pvVar36 + uVar35 * 0x20) = auVar38;
                uVar35 = uVar35 + 1;
              } while (uVar35 != _w);
            }
            pvVar36 = (void *)((long)pvVar36 + (long)(int)(_w * 8) * 4);
            bVar37 = iVar6 != iVar29;
            iVar6 = iVar6 + 1;
          } while (bVar37);
        }
        local_240 = local_240 + 1;
        iVar24 = iVar24 + (int)sVar31 * 8;
      } while (local_240 != uVar27);
    }
    pLVar10 = this->activation;
    if (pLVar10 != (Layer *)0x0) {
      (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
    }
    if (local_168.data != (void *)0x0) {
      operator_delete(local_168.data,
                      CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize) -
                      (long)local_168.data);
    }
  }
  iVar30 = 0;
LAB_004567c8:
  piVar9 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_208.data != (Allocator *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar30;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}